

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

size_t fio_ltoa(char *dest,int64_t num,uint8_t base)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  uint64_t t_1;
  uint64_t l;
  uint64_t t;
  uint64_t l_1;
  uint8_t tmp;
  ulong uStack_98;
  uint8_t i_1;
  uint64_t n_1;
  uint64_t l_2;
  ulong uStack_80;
  uint8_t i;
  uint64_t n;
  char buf [48];
  char *local_40;
  size_t len;
  char notation [16];
  long lStack_20;
  uint8_t base_local;
  int64_t num_local;
  char *dest_local;
  
  notation[0xf] = base;
  len = 0x3736353433323130;
  builtin_strncpy(notation,"89ABCDEF",8);
  local_40 = (char *)0x0;
  if (num == 0) {
    uVar3 = (uint)base;
    if (uVar3 - 1 < 2) {
      *dest = '0';
      local_40 = (char *)0x2;
      dest[1] = 'b';
    }
    else if (uVar3 == 8) {
      local_40 = (char *)0x1;
      *dest = '0';
    }
    else if (uVar3 == 0x10) {
      *dest = '0';
      dest[1] = 'x';
      local_40 = (char *)0x3;
      dest[2] = '0';
    }
    dest_local = (char *)((long)local_40 + 1);
    dest[(long)local_40] = '0';
    dest[(long)dest_local] = '\0';
  }
  else {
    lStack_20 = num;
    switch(base) {
    case '\x01':
    case '\x02':
      l_2._7_1_ = 0;
      *dest = '0';
      local_40 = (char *)0x2;
      dest[1] = 'b';
      uStack_80 = num;
      for (; l_2._7_1_ < 0x40 && (uStack_80 & 0x8000000000000000) == 0; l_2._7_1_ = l_2._7_1_ + 1) {
        uStack_80 = uStack_80 << 1;
      }
      if (l_2._7_1_ != 0) {
        local_40 = (char *)0x3;
        dest[2] = '0';
      }
      for (; l_2._7_1_ < 0x40; l_2._7_1_ = l_2._7_1_ + 1) {
        cVar2 = '0';
        if ((uStack_80 & 0x8000000000000000) != 0) {
          cVar2 = '1';
        }
        dest[(long)local_40] = cVar2;
        uStack_80 = uStack_80 << 1;
        local_40 = local_40 + 1;
      }
      dest[(long)local_40] = '\0';
      dest_local = local_40;
      break;
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\t':
      if (num < 0) {
        *dest = '-';
        lStack_20 = -num;
      }
      local_40 = (char *)(ulong)(num < 0);
      t = 0;
      while (lStack_20 != 0) {
        uVar4 = (ulong)(byte)notation[0xf];
        buf[t - 8] = ((char)lStack_20 - (char)(lStack_20 / (long)uVar4) * notation[0xf]) + '0';
        t = t + 1;
        lStack_20 = lStack_20 / (long)uVar4;
      }
      while (t != 0) {
        dest[(long)local_40] = (&i)[t];
        t = t - 1;
        local_40 = local_40 + 1;
      }
      dest[(long)local_40] = '\0';
      dest_local = local_40;
      break;
    case '\b':
      n_1 = 0;
      if (num < 0) {
        *dest = '-';
        lStack_20 = -num;
      }
      local_40 = (char *)(ulong)(num < 0);
      dest[(long)local_40] = '0';
      for (; lStack_20 != 0; lStack_20 = lStack_20 >> 3) {
        buf[n_1 - 8] = ((byte)lStack_20 & 7) + 0x30;
        n_1 = n_1 + 1;
      }
      while (local_40 = local_40 + 1, n_1 != 0) {
        dest[(long)local_40] = (&i)[n_1];
        n_1 = n_1 - 1;
      }
      dest[(long)local_40] = '\0';
      dest_local = local_40;
      break;
    default:
      if (num < 0) {
        *dest = '-';
        lStack_20 = -num;
      }
      local_40 = (char *)(ulong)(num < 0);
      t_1 = 0;
      while (lStack_20 != 0) {
        buf[t_1 - 8] = (char)lStack_20 + (char)(lStack_20 / 10) * -10 + '0';
        t_1 = t_1 + 1;
        lStack_20 = lStack_20 / 10;
      }
      while (t_1 != 0) {
        dest[(long)local_40] = (&i)[t_1];
        t_1 = t_1 - 1;
        local_40 = local_40 + 1;
      }
      dest[(long)local_40] = '\0';
      dest_local = local_40;
      break;
    case '\x10':
      l_1._7_1_ = 0;
      *dest = '0';
      local_40 = (char *)0x2;
      dest[1] = 'x';
      uStack_98 = num;
      for (; l_1._7_1_ < 8 && (uStack_98 & 0xff00000000000000) == 0; l_1._7_1_ = l_1._7_1_ + 1) {
        uStack_98 = uStack_98 << 8;
      }
      if ((l_1._7_1_ != 0) && ((uStack_98 & 0x8000000000000000) != 0)) {
        dest[2] = '0';
        local_40 = (char *)0x4;
        dest[3] = '0';
      }
      for (; l_1._7_1_ < 8; l_1._7_1_ = l_1._7_1_ + 1) {
        bVar1 = (byte)(uStack_98 >> 0x38);
        pcVar5 = local_40 + 1;
        dest[(long)local_40] = notation[(ulong)(bVar1 >> 4) - 8];
        local_40 = local_40 + 2;
        dest[(long)pcVar5] = notation[(ulong)(bVar1 & 0xf) - 8];
        uStack_98 = uStack_98 << 8;
      }
      dest[(long)local_40] = '\0';
      dest_local = local_40;
    }
  }
  return (size_t)dest_local;
}

Assistant:

size_t fio_ltoa(char *dest, int64_t num, uint8_t base) {
  const char notation[] = {'0', '1', '2', '3', '4', '5', '6', '7',
                           '8', '9', 'A', 'B', 'C', 'D', 'E', 'F'};

  size_t len = 0;
  char buf[48]; /* we only need up to 20 for base 10, but base 3 needs 41... */

  if (!num)
    goto zero;

  switch (base) {
  case 1: /* fallthrough */
  case 2:
    /* Base 2 */
    {
      uint64_t n = num; /* avoid bit shifting inconsistencies with signed bit */
      uint8_t i = 0;    /* counting bits */
      dest[len++] = '0';
      dest[len++] = 'b';

      while ((i < 64) && (n & 0x8000000000000000) == 0) {
        n = n << 1;
        i++;
      }
      /* make sure the Binary representation doesn't appear signed. */
      if (i) {
        dest[len++] = '0';
      }
      /* write to dest. */
      while (i < 64) {
        dest[len++] = ((n & 0x8000000000000000) ? '1' : '0');
        n = n << 1;
        i++;
      }
      dest[len] = 0;
      return len;
    }
  case 8:
    /* Base 8 */
    {
      uint64_t l = 0;
      if (num < 0) {
        dest[len++] = '-';
        num = 0 - num;
      }
      dest[len++] = '0';

      while (num) {
        buf[l++] = '0' + (num & 7);
        num = num >> 3;
      }
      while (l) {
        --l;
        dest[len++] = buf[l];
      }
      dest[len] = 0;
      return len;
    }

  case 16:
    /* Base 16 */
    {
      uint64_t n = num; /* avoid bit shifting inconsistencies with signed bit */
      uint8_t i = 0;    /* counting bits */
      dest[len++] = '0';
      dest[len++] = 'x';
      while (i < 8 && (n & 0xFF00000000000000) == 0) {
        n = n << 8;
        i++;
      }
      /* make sure the Hex representation doesn't appear misleadingly signed. */
      if (i && (n & 0x8000000000000000)) {
        dest[len++] = '0';
        dest[len++] = '0';
      }
      /* write the damn thing, high to low */
      while (i < 8) {
        uint8_t tmp = (n & 0xF000000000000000) >> 60;
        dest[len++] = notation[tmp];
        tmp = (n & 0x0F00000000000000) >> 56;
        dest[len++] = notation[tmp];
        i++;
        n = n << 8;
      }
      dest[len] = 0;
      return len;
    }
  case 3: /* fallthrough */
  case 4: /* fallthrough */
  case 5: /* fallthrough */
  case 6: /* fallthrough */
  case 7: /* fallthrough */
  case 9: /* fallthrough */
    /* rare bases */
    if (num < 0) {
      dest[len++] = '-';
      num = 0 - num;
    }
    uint64_t l = 0;
    while (num) {
      uint64_t t = num / base;
      buf[l++] = '0' + (num - (t * base));
      num = t;
    }
    while (l) {
      --l;
      dest[len++] = buf[l];
    }
    dest[len] = 0;
    return len;

  default:
    break;
  }
  /* Base 10, the default base */

  if (num < 0) {
    dest[len++] = '-';
    num = 0 - num;
  }
  uint64_t l = 0;
  while (num) {
    uint64_t t = num / 10;
    buf[l++] = '0' + (num - (t * 10));
    num = t;
  }
  while (l) {
    --l;
    dest[len++] = buf[l];
  }
  dest[len] = 0;
  return len;

zero:
  switch (base) {
  case 1:
  case 2:
    dest[len++] = '0';
    dest[len++] = 'b';
    break;
  case 8:
    dest[len++] = '0';
    break;
  case 16:
    dest[len++] = '0';
    dest[len++] = 'x';
    dest[len++] = '0';
    break;
  }
  dest[len++] = '0';
  dest[len] = 0;
  return len;
}